

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
* __thiscall backend::codegen::RegAllocator::sort_intervals(RegAllocator *this)

{
  bool bVar1;
  reference ppVar2;
  iterator iVar3;
  iterator iVar4;
  long in_RSI;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  *in_RDI;
  pair<const_unsigned_int,_backend::codegen::Interval> interval_pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *__range2;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  intervals;
  value_type *in_stack_ffffffffffffff48;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  *in_stack_ffffffffffffff50;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  *this_00;
  size_type in_stack_ffffffffffffff78;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  *in_stack_ffffffffffffff80;
  pair<unsigned_int,_backend::codegen::Interval> local_6c;
  pair<const_unsigned_int,_backend::codegen::Interval> local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_48;
  long local_40;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  local_28;
  
  std::
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::vector((vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
            *)0x2420f3);
  std::
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  ::size((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
          *)0x242104);
  std::
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::reserve(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_40 = in_RSI + 0xe0;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::begin((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                *)in_stack_ffffffffffffff48);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::end((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
              *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                          *)0x242160);
    local_60.second.end = (ppVar2->second).end;
    local_60.first = ppVar2->first;
    local_60.second.start = (ppVar2->second).start;
    std::pair<unsigned_int,_backend::codegen::Interval>::
    pair<const_unsigned_int,_backend::codegen::Interval,_true>(&local_6c,&local_60);
    std::
    vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                *)in_stack_ffffffffffffff50);
  }
  this_00 = &local_28;
  iVar3 = std::
          vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
          ::begin((vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                   *)in_stack_ffffffffffffff48);
  iVar4 = std::
          vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
          ::end((vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                 *)in_stack_ffffffffffffff48);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,backend::codegen::RegAllocator::sort_intervals()::__0>
            (iVar3._M_current,iVar4._M_current);
  std::
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::vector(this_00,(vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                    *)in_stack_ffffffffffffff48);
  std::
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::~vector(in_RDI);
  return in_RDI;
}

Assistant:

std::vector<std::pair<Reg, Interval>> RegAllocator::sort_intervals() {
  //   Initialize vector
  std::vector<std::pair<Reg, Interval>> intervals;
  intervals.reserve(live_intervals.size());
  for (auto interval_pair : live_intervals) {
    intervals.push_back(interval_pair);
  }
  //   sort by interval starting point
  std::sort(intervals.begin(), intervals.end(), [](auto &first, auto &second) {
    return first.second.start < second.second.start;
  });

  return std::move(intervals);
}